

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O3

void on_tcp_child_process_read(uv_stream_t *tcp,ssize_t nread,uv_buf_t *buf)

{
  char *__s2;
  int iVar1;
  ulong extraout_RAX;
  undefined8 uVar2;
  undefined1 local_20 [16];
  
  if (nread < 0) {
    if (nread == -0xfff) {
      free(buf->base);
      return;
    }
    goto LAB_001635d0;
  }
  if (nread == 0) {
    on_tcp_child_process_read_cold_3();
LAB_001635c6:
    on_tcp_child_process_read_cold_1();
  }
  else {
    __s2 = buf->base;
    iVar1 = bcmp("world\n",__s2,nread);
    if (iVar1 != 0) goto LAB_001635c6;
    on_pipe_read_called = on_pipe_read_called + 1;
    free(__s2);
    local_20 = uv_buf_init("hello again\n",0xc);
    iVar1 = uv_write(0x2e6e60,tcp,local_20,1,tcp_connection_write_cb);
    if (iVar1 == 0) {
      tcp_conn_read_cb_called = tcp_conn_read_cb_called + 1;
      return;
    }
  }
  on_tcp_child_process_read_cold_2();
  nread = extraout_RAX;
LAB_001635d0:
  uVar2 = uv_strerror(nread & 0xffffffff);
  printf("error recving on tcp connection: %s\n",uVar2);
  abort();
}

Assistant:

static void on_tcp_child_process_read(uv_stream_t* tcp,
                                      ssize_t nread,
                                      const uv_buf_t* buf) {
  uv_buf_t outbuf;
  int r;

  if (nread < 0) {
    if (nread == UV_EOF) {
      free(buf->base);
      return;
    }

    printf("error recving on tcp connection: %s\n", uv_strerror(nread));
    abort();
  }

  ASSERT(nread > 0);
  ASSERT(memcmp("world\n", buf->base, nread) == 0);
  on_pipe_read_called++;
  free(buf->base);

  /* Write to the socket */
  outbuf = uv_buf_init("hello again\n", 12);
  r = uv_write(&conn.tcp_write_req, tcp, &outbuf, 1, tcp_connection_write_cb);
  ASSERT(r == 0);

  tcp_conn_read_cb_called++;
}